

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O2

_Bool duckdb_je_ckh_iter(ckh_t *ckh,size_t *tabind,void **key,void **data)

{
  void *pvVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  
  sVar2 = *tabind;
  lVar3 = sVar2 << 4;
  do {
    uVar4 = sVar2 >> ((char)ckh->lg_curbuckets + 2U & 0x3f);
    if (uVar4 != 0) {
LAB_00e792d9:
      return uVar4 != 0;
    }
    pvVar1 = *(void **)((long)&ckh->tab->key + lVar3);
    if (pvVar1 != (void *)0x0) {
      if (key != (void **)0x0) {
        *key = pvVar1;
      }
      if (data != (void **)0x0) {
        *data = *(void **)((long)&ckh->tab->data + lVar3);
      }
      *tabind = sVar2 + 1;
      goto LAB_00e792d9;
    }
    sVar2 = sVar2 + 1;
    lVar3 = lVar3 + 0x10;
  } while( true );
}

Assistant:

bool
ckh_iter(ckh_t *ckh, size_t *tabind, void **key, void **data) {
	size_t i, ncells;

	for (i = *tabind, ncells = (ZU(1) << (ckh->lg_curbuckets +
	    LG_CKH_BUCKET_CELLS)); i < ncells; i++) {
		if (ckh->tab[i].key != NULL) {
			if (key != NULL) {
				*key = (void *)ckh->tab[i].key;
			}
			if (data != NULL) {
				*data = (void *)ckh->tab[i].data;
			}
			*tabind = i + 1;
			return false;
		}
	}

	return true;
}